

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.hpp
# Opt level: O2

RealType __thiscall OpenMD::Bend::getValue(Bend *this,int snapshotNo)

{
  SnapshotManager *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar3;
  double dVar4;
  double dVar5;
  Vector3d r23;
  Vector3d r21;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  StuntDouble::getPos((Vector3d *)&local_48,
                      &(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble,snapshotNo);
  StuntDouble::getPos((Vector3d *)&local_60,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble,snapshotNo);
  StuntDouble::getPos((Vector3d *)&local_78,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2]->super_StuntDouble,snapshotNo);
  operator-(&local_c0,&local_48,&local_60);
  Vector<double,_3U>::Vector(&local_90,&local_c0);
  pSVar1 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var,iVar2),(Vector3d *)&local_90);
  dVar3 = Vector<double,_3U>::length(&local_90);
  operator-(&local_a8,&local_78,&local_60);
  Vector<double,_3U>::Vector(&local_c0,&local_a8);
  pSVar1 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_00,iVar2),(Vector3d *)&local_c0);
  dVar4 = Vector<double,_3U>::length(&local_c0);
  dVar5 = dot<double,3u>(&local_90,&local_c0);
  dVar5 = dVar5 / (dVar4 * dVar3);
  dVar3 = 1.0;
  if ((dVar5 <= 1.0) && (dVar3 = dVar5, dVar5 < -1.0)) {
    dVar3 = -1.0;
  }
  dVar3 = acos(dVar3);
  return dVar3;
}

Assistant:

RealType getValue(int snapshotNo) {
      Vector3d pos1 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[2]->getPos(snapshotNo);

      Vector3d r21 = pos1 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r21);
      RealType d21 = r21.length();

      Vector3d r23 = pos3 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r23);
      RealType d23 = r23.length();

      RealType cosTheta = dot(r21, r23) / (d21 * d23);

      // check roundoff
      if (cosTheta > 1.0) {
        cosTheta = 1.0;
      } else if (cosTheta < -1.0) {
        cosTheta = -1.0;
      }

      return acos(cosTheta);
    }